

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# camgeom.cc
# Opt level: O2

void gmath::refineOptimal(Matrix34d *RT1,Vector3d *p0,Vector3d *p1)

{
  double dVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  SMatrix<double,_3,_3> *a;
  SMatrix<double,_3,_3> *a_00;
  SMatrix<double,_3,_3> *a_01;
  SMatrix<double,_3,_3> *a_02;
  SMatrix<double,_3,_3> *a_03;
  double dVar5;
  double dVar6;
  double dVar7;
  undefined1 auVar8 [16];
  double dVar9;
  undefined1 auVar10 [16];
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  undefined1 auVar15 [16];
  double dVar16;
  Polynomiald p;
  SVector<double,_3> local_380;
  undefined1 local_368 [16];
  double local_358;
  undefined8 uStack_350;
  double local_348;
  undefined8 uStack_340;
  double local_338;
  undefined8 uStack_330;
  double local_328;
  undefined8 uStack_320;
  vector<double,_std::allocator<double>_> r;
  SMatrix<double,_3,_3> local_2d0;
  Vector3d T;
  SMatrix<double,_3,_3> local_270;
  Matrix33d R1;
  Matrix33d R0;
  Vector3d e0;
  Vector3d e1;
  Matrix33d invT1;
  Matrix33d invT0;
  Matrix33d F;
  Matrix33d R;
  
  getRotation(&R,RT1);
  SMatrix<double,_3,_4>::getColumn(&T,RT1,3);
  createEssential(&F,&R,&T);
  SMatrix<double,_3,_3>::SMatrix(&invT0);
  SMatrix<double,_3,_3>::SMatrix((SMatrix<double,_3,_3> *)&invT1);
  invT0.v[0][2] = p0->v[0] / p0->v[2];
  invT0.v[1][2] = p0->v[1] / p0->v[2];
  invT1.v[0][2] = p1->v[0] / p1->v[2];
  invT1.v[1][2] = p1->v[1] / p1->v[2];
  transpose<double,3,3>(&local_2d0,(gmath *)&invT1,a);
  operator*(&R1,&local_2d0,&F);
  operator*(&R0,&R1,&invT0);
  SMatrix<double,_3,_3>::operator=(&F,&R0);
  SVector<double,_3>::SVector(&e1,&T);
  transpose<double,3,3>(&R0,(gmath *)&R,a_00);
  SVector<double,_3>::operator-((SVector<double,_3> *)&R1,&T);
  SMatrix<double,_3,_3>::operator*(&e0,&R0,(SVector<double,_3> *)&R1);
  SVector<double,_3>::operator/=(&e0,e0.v[2]);
  SVector<double,_3>::operator/=(&e1,e1.v[2]);
  dVar1 = p0->v[2];
  auVar8._8_4_ = SUB84(dVar1,0);
  auVar8._0_8_ = dVar1;
  auVar8._12_4_ = (int)((ulong)dVar1 >> 0x20);
  auVar8 = divpd(*(undefined1 (*) [16])p0->v,auVar8);
  dVar1 = e0.v[0] - auVar8._0_8_;
  dVar7 = e0.v[1] - auVar8._8_8_;
  e0.v[1]._0_4_ = SUB84(dVar7,0);
  e0.v[0] = dVar1;
  e0.v[1]._4_4_ = (int)((ulong)dVar7 >> 0x20);
  auVar2._8_8_ = p1->v[2];
  auVar2._0_8_ = p1->v[2];
  auVar8 = divpd(*(undefined1 (*) [16])p1->v,auVar2);
  e1.v[0] = e1.v[0] - auVar8._0_8_;
  e1.v[1] = e1.v[1] - auVar8._8_8_;
  SVector<double,_3>::operator/=(&e0,SQRT(dVar1 * dVar1 + dVar7 * dVar7));
  SVector<double,_3>::operator/=(&e1,SQRT(e1.v[0] * e1.v[0] + e1.v[1] * e1.v[1]));
  SMatrix<double,_3,_3>::SMatrix((SMatrix<double,_3,_3> *)&R0);
  R0.v[0][0]._0_4_ = e0.v[0]._0_4_;
  R0.v[0][0]._4_4_ = e0.v[0]._4_4_;
  R0.v[0][1]._0_4_ = e0.v[1]._0_4_;
  R0.v[0][1]._4_4_ = e0.v[1]._4_4_;
  R0.v[1][0]._4_4_ = e0.v[1]._4_4_ ^ 0x80000000;
  R0.v[1][0]._0_4_ = e0.v[1]._0_4_;
  R0.v[1][1]._0_4_ = e0.v[0]._0_4_;
  R0.v[1][1]._4_4_ = e0.v[0]._4_4_;
  R0.v[2][2] = 1.0;
  SMatrix<double,_3,_3>::SMatrix(&R1);
  R1.v[0][0]._0_4_ = e1.v[0]._0_4_;
  R1.v[0][0]._4_4_ = e1.v[0]._4_4_;
  R1.v[0][1]._0_4_ = e1.v[1]._0_4_;
  R1.v[0][1]._4_4_ = e1.v[1]._4_4_;
  R1.v[1][0]._4_4_ = e1.v[1]._4_4_ ^ 0x80000000;
  R1.v[1][0]._0_4_ = e1.v[1]._0_4_;
  R1.v[1][1]._0_4_ = e1.v[0]._0_4_;
  R1.v[1][1]._4_4_ = e1.v[0]._4_4_;
  R1.v[2][2] = 1.0;
  operator*(&local_270,&R1,&F);
  transpose<double,3,3>((SMatrix<double,_3,_3> *)&r,(gmath *)&R0,a_01);
  operator*(&local_2d0,&local_270,(SMatrix<double,_3,_3> *)&r);
  SMatrix<double,_3,_3>::operator=(&F,&local_2d0);
  dVar1 = F.v[1][2] * F.v[1][2];
  dVar5 = F.v[2][2] * F.v[2][2];
  Polynomial<double>::Polynomial(&p);
  uStack_320 = 0x8000000000000000;
  local_328 = -(F.v[1][1] * F.v[1][2]) * dVar5;
  dVar7 = dVar1 * F.v[2][1] * F.v[2][2];
  Polynomial<double>::set(&p,0,dVar7 + local_328);
  dVar9 = e1.v[2] * e1.v[2];
  dVar12 = F.v[1][1] * F.v[1][1];
  dVar6 = F.v[2][1] * F.v[2][1];
  dVar16 = dVar1 + dVar1;
  Polynomial<double>::set
            (&p,1,dVar5 * dVar5 * dVar9 * dVar9 +
                  dVar16 * dVar5 * dVar9 + ((dVar1 * dVar1 + dVar1 * dVar6) - dVar12 * dVar5));
  dVar13 = e0.v[2] * e0.v[2];
  local_358 = -dVar12;
  uStack_350 = 0x8000000000000000;
  dVar11 = F.v[1][1] * F.v[1][2] * dVar6;
  dVar14 = F.v[2][1] * local_358 * F.v[2][2];
  local_368._8_8_ = 0;
  local_368._0_8_ = dVar14;
  local_348 = (F.v[1][1] + F.v[1][1]) * F.v[1][2];
  uStack_340 = 0;
  local_338 = F.v[1][1] * 4.0 * F.v[1][2];
  uStack_330 = 0;
  Polynomial<double>::set
            (&p,2,F.v[2][1] * 4.0 * dVar5 * F.v[2][2] * dVar9 * dVar9 +
                  local_338 * dVar5 * dVar9 +
                  dVar1 * 4.0 * F.v[2][1] * F.v[2][2] * dVar9 +
                  ((F.v[2][1] * dVar16 * F.v[2][2] * dVar13 +
                   F.v[1][1] * 4.0 * dVar1 * F.v[1][2] + dVar11 + dVar14) -
                  dVar5 * local_348 * dVar13));
  dVar14 = dVar12 + dVar12;
  Polynomial<double>::set
            (&p,3,dVar6 * 6.0 * dVar5 * dVar9 * dVar9 +
                  dVar14 * dVar5 * dVar9 +
                  F.v[1][1] * 8.0 * F.v[1][2] * F.v[2][1] * F.v[2][2] * dVar9 +
                  dVar16 * dVar6 * dVar9 +
                  ((dVar12 * 6.0 * dVar1 + dVar13 * dVar16 * dVar6) - dVar14 * dVar5 * dVar13));
  dVar16 = dVar13 * dVar13;
  Polynomial<double>::set
            (&p,4,dVar6 * 4.0 * F.v[2][1] * F.v[2][2] * dVar9 * dVar9 +
                  dVar12 * 4.0 * F.v[2][1] * F.v[2][2] * dVar9 +
                  local_338 * dVar6 * dVar9 +
                  local_328 * dVar16 +
                  dVar7 * dVar16 +
                  ((F.v[1][1] * dVar12 * 4.0 * F.v[1][2] + local_348 * dVar6 * dVar13) -
                  F.v[2][1] * dVar14 * F.v[2][2] * dVar13));
  Polynomial<double>::set
            (&p,5,dVar6 * dVar6 * dVar9 * dVar9 +
                  dVar14 * dVar6 * dVar9 +
                  dVar5 * local_358 * dVar16 + dVar12 * dVar12 + dVar1 * dVar6 * dVar16);
  Polynomial<double>::set(&p,6,dVar11 * dVar16 + (double)local_368._0_8_ * dVar16);
  realRoots(&r,&p);
  dVar7 = 1.79769313486232e+308;
  dVar1 = 1.79769313486232e+308;
  for (a_02 = (SMatrix<double,_3,_3> *)0x0;
      (SMatrix<double,_3,_3> *)
      ((long)r.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
             _M_finish -
       (long)r.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
             _M_start >> 3) != a_02; a_02 = (SMatrix<double,_3,_3> *)((long)a_02->v[0] + 1)) {
    dVar16 = r.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
             _M_start[(long)a_02];
    dVar11 = F.v[1][1] * dVar16 + F.v[1][2];
    dVar14 = F.v[2][1] * dVar16 + F.v[2][2];
    dVar11 = dVar11 * dVar11 + dVar9 * dVar14 * dVar14;
    if ((dVar11 != 0.0) || (NAN(dVar11))) {
      auVar15._0_8_ = dVar16 * dVar16;
      auVar15._8_8_ = dVar14 * dVar14;
      auVar4._8_8_ = dVar11;
      auVar4._0_8_ = dVar13 * dVar16 * dVar16 + 1.0;
      auVar8 = divpd(auVar15,auVar4);
      dVar11 = auVar8._8_8_ + auVar8._0_8_;
      if (dVar11 < dVar1) {
        dVar1 = dVar11;
        dVar7 = dVar16;
      }
    }
  }
  if (((dVar13 <= 0.0) || (dVar16 = dVar9 * F.v[2][1] * F.v[2][1] + dVar12, dVar16 <= 0.0)) ||
     (auVar10._8_8_ = dVar6, auVar10._0_8_ = 0x3ff0000000000000, auVar3._8_8_ = dVar16,
     auVar3._0_8_ = dVar13, auVar8 = divpd(auVar10,auVar3), dVar1 <= auVar8._8_8_ + auVar8._0_8_)) {
    p0->v[0] = e0.v[2] * dVar7 * dVar7;
    p0->v[1] = dVar7;
    p0->v[2] = dVar7 * dVar7 * dVar13 + 1.0;
    dVar12 = F.v[2][1] * dVar7 + F.v[2][2];
    dVar1 = F.v[1][1] * dVar7 + F.v[1][2];
    p1->v[0] = dVar12 * e1.v[2] * dVar12;
    p1->v[1] = dVar12 * -dVar1;
    dVar12 = dVar9 * dVar12 * dVar12 + dVar1 * dVar1;
  }
  else {
    p0->v[0] = e0.v[2];
    p0->v[1] = 0.0;
    p0->v[2] = dVar13;
    p1->v[0] = dVar6 * e1.v[2];
    p1->v[1] = -F.v[1][1] * F.v[2][1];
    dVar12 = dVar9 * dVar6 + dVar12;
  }
  p1->v[2] = dVar12;
  transpose<double,3,3>(&local_270,(gmath *)&R0,a_02);
  operator*(&local_2d0,&invT0,&local_270);
  SMatrix<double,_3,_3>::operator*(&local_380,&local_2d0,p0);
  SVector<double,_3>::operator=(p0,&local_380);
  transpose<double,3,3>(&local_270,(gmath *)&R1,a_03);
  operator*(&local_2d0,&invT1,&local_270);
  SMatrix<double,_3,_3>::operator*(&local_380,&local_2d0,p1);
  SVector<double,_3>::operator=(p1,&local_380);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&r.super__Vector_base<double,_std::allocator<double>_>);
  Polynomial<double>::~Polynomial(&p);
  return;
}

Assistant:

void refineOptimal(const Matrix34d &RT1, Vector3d &p0, Vector3d &p1)
{
  const Matrix33d R=getRotation(RT1);
  const Vector3d T=RT1.getColumn(3);
  Matrix33d F=createEssential(R, T);

  // the implementation follows Hartley and Zisserman's (2003, pp. 318)

  Matrix33d invT0;
  Matrix33d invT1;
  invT0(0, 2)=p0[0]/p0[2];
  invT0(1, 2)=p0[1]/p0[2];
  invT1(0, 2)=p1[0]/p1[2];
  invT1(1, 2)=p1[1]/p1[2];

  // transform F

  F=transpose(invT1)*F*invT0;

  // get epipoles that correspond to new fundamental matrix

  Vector3d e1=T;
  Vector3d e0=transpose(R)*-T;

  e0/=e0[2];
  e1/=e1[2];
  e0[0]-=p0[0]/p0[2];
  e0[1]-=p0[1]/p0[2];
  e1[0]-=p1[0]/p1[2];
  e1[1]-=p1[1]/p1[2];

  // compute rotations

  e0/=sqrt(e0[0]*e0[0]+e0[1]*e0[1]);
  e1/=sqrt(e1[0]*e1[0]+e1[1]*e1[1]);

  Matrix33d R0;
  R0(0, 0)=e0[0];
  R0(0, 1)=e0[1];
  R0(1, 0)=-e0[1];
  R0(1, 1)=e0[0];
  R0(2, 2)=1;

  Matrix33d R1;
  R1(0, 0)=e1[0];
  R1(0, 1)=e1[1];
  R1(1, 0)=-e1[1];
  R1(1, 1)=e1[0];
  R1(2, 2)=1;

  // compute new F

  F=R1*F*transpose(R0);

  // compute coefficients of polynomial

  const double f=e0[2];
  const double g=e1[2];
  const double a=F(1, 1);
  const double b=F(1, 2);
  const double c=F(2, 1);
  const double d=F(2, 2);
  const double f2=f*f;
  const double f4=f2*f2;
  const double g2=g*g;
  const double a2=a*a;
  const double b2=b*b;
  const double c2=c*c;
  const double d2=d*d;

  Polynomiald p;
  p.set(0, b2*c*d-a*b*d2);
  p.set(1, b2*b2+b2*c2-a2*d2+2*b2*d2*g2+d2*d2*g2*g2);
  p.set(2, 4*a*b2*b+a*b*c2-a2*c*d+2*b2*c*d*f2-2*a*b*d2*f2+4*b2*c*d*g2+4*a*b*d2*g2
        +4*c*d2*d*g2*g2);
  p.set(3, 6*a2*b2+2*b2*c2*f2-2*a2*d2*f2+2*b2*c2*g2+8*a*b*c*d*g2+2*a2*d2*g2
        +6*c2*d2*g2*g2);
  p.set(4, 4*a2*a*b+2*a*b*c2*f2-2*a2*c*d*f2+b2*c*d*f4-a*b*d2*f4+4*a*b*c2*g2
        +4*a2*c*d*g2+4*c2*c*d*g2*g2);
  p.set(5, a2*a2+b2*c2*f4-a2*d2*f4+2*a2*c2*g2+c2*c2*g2*g2);
  p.set(6, a*b*c2*f4-a2*c*d*f4);

  // setting polynomial to 0 and get all real roots

  std::vector<double> r=realRoots(p);

  // find global minima (solution is t)

  double t=std::numeric_limits<double>::max();
  double mins=std::numeric_limits<double>::max();

  for (size_t i=0; i<r.size(); i++)
  {
    double s=(a*r[i]+b)*(a*r[i]+b)+g*g*(c*r[i]+d)*(c*r[i]+d);

    if (s != 0)
    {
      s=r[i]*r[i]/(1+f*f*r[i]*r[i])+(c*r[i]+d)*(c*r[i]+d)/s;

      if (s < mins)
      {
        t=r[i];
        mins=s;
      }
    }
  }

  // get optimal corner positions

  if (f*f > 0 && a*a+g*g*c*c > 0 && 1/(f*f)+c*c/(a*a+g*g*c*c) < mins)
  {
    p0[0]=f;
    p0[1]=0;
    p0[2]=f2;
    p1[0]=g*c2;
    p1[1]=-a*c;
    p1[2]=g2*c2+a2;
  }
  else
  {
    p0[0]=t*t*f;
    p0[1]=t;
    p0[2]=t*t*f2+1;
    p1[0]=g*(c*t+d)*(c*t+d);
    p1[1]=-(a*t+b)*(c*t+d);
    p1[2]=g2*(c*t+d)*(c*t+d)+(a*t+b)*(a*t+b);
  }

  // transform refined points back

  p0=invT0*transpose(R0)*p0;
  p1=invT1*transpose(R1)*p1;
}